

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  JavaType type;
  char *pcVar4;
  mapped_type *pmVar5;
  string *psVar6;
  MessageOptions *this_00;
  EnumDescriptor *descriptor;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  ImmutableFieldLiteGenerator *pIVar9;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *this_01;
  reference ppOVar10;
  OneofGeneratorInfo *pOVar11;
  FileDescriptor *descriptor_00;
  int __c;
  Descriptor *descriptor_01;
  ulong uVar12;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *field_00;
  AlphaNum *a_02;
  ImmutableExtensionLiteGenerator local_8c0;
  int local_884;
  char *pcStack_880;
  int i_5;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  AlphaNum local_7b8;
  string local_788;
  string local_768;
  int local_748;
  allocator local_741;
  int i_4;
  string local_720;
  string local_700;
  AlphaNum local_6e0;
  string local_6b0;
  FieldDescriptor *local_690;
  FieldDescriptor *field_1;
  int j_1;
  string local_660;
  AlphaNum local_640;
  string local_610;
  string local_5f0;
  FieldDescriptor *local_5d0;
  FieldDescriptor *field;
  int j;
  AlphaNum local_5a0;
  string local_570;
  allocator local_549;
  key_type local_548;
  allocator local_521;
  key_type local_520;
  OneofDescriptor *local_500;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  uint local_490;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageLiteGenerator messageGenerator;
  undefined1 local_408 [4];
  int i_1;
  int local_3b4;
  undefined1 local_3b0 [4];
  int i;
  SubstituteArg local_380;
  SubstituteArg local_350;
  SubstituteArg local_320;
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  string local_200;
  SubstituteArg local_1e0;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  string local_168 [8];
  string builder_type;
  string local_140;
  allocator local_119;
  key_type local_118;
  allocator local_f1;
  key_type local_f0;
  string local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  pcVar4 = " static ";
  if ((variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    pcVar4 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"static",&local_71);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar4);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  psVar6 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"classname",&local_a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ExtraMessageInterfaces_abi_cxx11_
            (&local_d0,(java *)(this->super_MessageGenerator).descriptor_,descriptor_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"extra_interfaces",&local_f1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar1 = MessageOptions::deprecated(this_00);
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"deprecation",&local_119);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_118);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar4);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"",(allocator *)(builder_type.field_2._M_local_buf + 0xf));
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar7,true,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_168);
  iVar2 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (iVar2 < 1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::operator=(local_168,"com.google.protobuf.GeneratedMessageLite.Builder");
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1a8,
               "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",&local_1a9);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_200,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e0,&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg(&local_260);
    strings::internal::SubstituteArg::SubstituteArg(&local_290);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_320);
    strings::internal::SubstituteArg::SubstituteArg(&local_350);
    strings::internal::SubstituteArg::SubstituteArg(&local_380);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_3b0);
    strings::Substitute(&local_188,&local_1a8,&local_1e0,&local_230,&local_260,&local_290,&local_2c0
                        ,&local_2f0,&local_320,&local_350,&local_380,(SubstituteArg *)local_3b0);
    std::__cxx11::string::operator=(local_168,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  for (local_3b4 = 0; iVar2 = local_3b4,
      iVar3 = Descriptor::enum_type_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3
      ; local_3b4 = local_3b4 + 1) {
    descriptor = Descriptor::enum_type((this->super_MessageGenerator).descriptor_,local_3b4);
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)local_408,descriptor,true,this->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)local_408,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_408);
  }
  for (messageGenerator.field_generators_.field_generators_.
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      iVar2 = messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      iVar3 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_),
      iVar2 < iVar3;
      messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           messageGenerator.field_generators_.field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pDVar7 = Descriptor::nested_type
                       ((this->super_MessageGenerator).descriptor_,
                        messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar1 = IsMapEntry(pDVar7);
    if (!bVar1) {
      pDVar7 = Descriptor::nested_type
                         ((this->super_MessageGenerator).descriptor_,
                          messageGenerator.field_generators_.field_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2,pDVar7,this->context_);
      GenerateInterface((ImmutableMessageLiteGenerator *)&i_2,printer);
      Generate((ImmutableMessageLiteGenerator *)&i_2,printer);
      ~ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2);
    }
  }
  totalInts = 0;
  for (i_3 = 0; iVar2 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
      i_3 < iVar2; i_3 = i_3 + 1) {
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_3);
    pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,pFVar8);
    iVar2 = (*pIVar9->_vptr_ImmutableFieldLiteGenerator[2])();
    totalInts = iVar2 + totalInts;
  }
  uVar12 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
  for (local_490 = 0; (int)local_490 < (totalInts + 0x1f) / 0x20; local_490 = local_490 + 1) {
    GetBitFieldName_abi_cxx11_
              ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (java *)(ulong)local_490,(int)uVar12);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    uVar12 = extraout_RDX;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range3);
  this_01 = &(this->super_MessageGenerator).oneofs_;
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(this_01);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(this_01);
  while (bVar1 = std::operator!=(&__end3,(_Self *)&oneof), bVar1) {
    ppOVar10 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                         (&__end3);
    local_500 = *ppOVar10;
    pOVar11 = Context::GetOneofGeneratorInfo(this->context_,local_500);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"oneof_name",&local_521);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_520);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)pOVar11);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    pOVar11 = Context::GetOneofGeneratorInfo(this->context_,local_500);
    psVar6 = &pOVar11->capitalized_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"oneof_capitalized_name",&local_549);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_548);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    pcVar4 = OneofDescriptor::index(local_500,(char *)psVar6,__c);
    strings::AlphaNum::AlphaNum(&local_5a0,(int)pcVar4);
    StrCat_abi_cxx11_(&local_570,(protobuf *)&local_5a0,a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j,"oneof_index",(allocator *)((long)&field + 7));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_570);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    std::__cxx11::string::~string((string *)&local_570);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range3,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range3,"public enum $oneof_capitalized_name$Case {\n");
    io::Printer::Indent(printer);
    for (field._0_4_ = 0; iVar2 = (int)field, iVar3 = OneofDescriptor::field_count(local_500),
        iVar2 < iVar3; field._0_4_ = (int)field + 1) {
      local_5d0 = OneofDescriptor::field(local_500,(int)field);
      psVar6 = FieldDescriptor::name_abi_cxx11_(local_5d0);
      ToUpper(&local_5f0,psVar6);
      iVar2 = FieldDescriptor::number(local_5d0);
      strings::AlphaNum::AlphaNum(&local_640,iVar2);
      StrCat_abi_cxx11_(&local_610,(protobuf *)&local_640,a_00);
      io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,"$field_name$($field_number$),\n",(char (*) [11])0x792674,&local_5f0,
                 (char (*) [13])"field_number",&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_5f0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j_1,"oneof_name",(allocator *)((long)&field_1 + 7));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,(key_type *)&j_1);
    ToUpper(&local_660,pmVar5);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&j_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field_1 + 7));
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range3,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range3,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    for (field_1._0_4_ = 0; iVar2 = (int)field_1, iVar3 = OneofDescriptor::field_count(local_500),
        iVar2 < iVar3; field_1._0_4_ = (int)field_1 + 1) {
      local_690 = OneofDescriptor::field(local_500,(int)field_1);
      iVar2 = FieldDescriptor::number(local_690);
      strings::AlphaNum::AlphaNum(&local_6e0,iVar2);
      StrCat_abi_cxx11_(&local_6b0,(protobuf *)&local_6e0,a_01);
      psVar6 = FieldDescriptor::name_abi_cxx11_(local_690);
      ToUpper(&local_700,psVar6);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"    case $field_number$: return $field_name$;\n",
                 (char (*) [13])"field_number",&local_6b0,(char (*) [11])0x792674,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_6b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_4,"oneof_name",&local_741);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,(key_type *)&i_4);
    ToUpper(&local_720,pmVar5);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
               ,(char (*) [15])"cap_oneof_name",&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&i_4);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n\n");
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range3,
                       "@java.lang.Override\npublic $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                      );
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  for (local_748 = 0; iVar2 = local_748,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3;
      local_748 = local_748 + 1) {
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_748);
    FieldConstantName_abi_cxx11_(&local_768,(java *)pFVar8,field_00);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_748);
    iVar2 = FieldDescriptor::number(pFVar8);
    strings::AlphaNum::AlphaNum(&local_7b8,iVar2);
    StrCat_abi_cxx11_(&local_788,(protobuf *)&local_7b8,a_02);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"public static final int $constant_name$ = $number$;\n",
               (char (*) [14])0x78fa3a,&local_768,(char (*) [7])0x79279d,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_768);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_748);
    pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,pFVar8);
    (*pIVar9->_vptr_ImmutableFieldLiteGenerator[4])(pIVar9,printer);
    io::Printer::Print<>(printer,"\n");
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar1 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print<>(printer,"private byte memoizedIsInitialized = 2;\n");
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_7d8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\n@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
             ,(char (*) [10])0x77c586,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"case NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuilder(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\ncase BUILD_MESSAGE_INFO: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_7f8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
             ,(char (*) [10])0x77c586,&local_7f8);
  std::__cxx11::string::~string((string *)&local_7f8);
  io::Printer::Outdent(printer);
  bVar1 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print<>
              (printer,
               "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
              );
  }
  else {
    io::Printer::Print<>
              (printer,
               "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  return null;\n}\n"
              );
  }
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_818,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n",
             (char (*) [10])0x77c586,&local_818);
  std::__cxx11::string::~string((string *)&local_818);
  psVar6 = Descriptor::full_name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x7872ae,psVar6);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_838,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x77c586,
             &local_838);
  std::__cxx11::string::~string((string *)&local_838);
  psVar6 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
             ,(char (*) [10])0x77c586,psVar6);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_858,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x77c586,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  descriptor_00 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  bVar1 = IsWrappersProtoFile(descriptor_00);
  if (bVar1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_878,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,0);
    type = GetJavaType(pFVar8);
    pcStack_880 = PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x77c586,&local_878,(char (*) [11])0x7a96a0,&stack0xfffffffffffff780)
    ;
    std::__cxx11::string::~string((string *)&local_878);
  }
  GenerateParser(this,printer);
  for (local_884 = 0; iVar2 = local_884,
      iVar3 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3
      ; local_884 = local_884 + 1) {
    pFVar8 = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_884);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (&local_8c0,pFVar8,this->context_);
    ImmutableExtensionLiteGenerator::Generate(&local_8c0,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&local_8c0);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range3);
  std::__cxx11::string::~string(local_168);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat((oneof)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars, "public enum $oneof_capitalized_name$Case {\n");
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     ToUpper(field->name()), "field_number",
                     StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO(b/135620659): Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "private void clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "// fall through\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return null;\n"
        "}\n");
  }

  printer->Outdent();
  printer->Print(
      "  }\n"
      "  throw new UnsupportedOperationException();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}